

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

int __thiscall DetectorSS::PointQueryMerge(DetectorSS *this,uint32_t key)

{
  uint uVar1;
  int iVar2;
  uchar **ppuVar3;
  int *piVar4;
  int iVar5;
  uchar *bmp;
  uint64_t uVar6;
  int iVar7;
  DetectorSS *pDVar8;
  int i;
  long lVar9;
  ulong uVar10;
  uint32_t key_local;
  long local_60;
  uint32_t hashval [4];
  uint32_t hkey [3];
  
  uVar10 = (ulong)((this->ss_).offsets[(this->ss_).c] + 7 >> 3);
  key_local = key;
  bmp = (uchar *)operator_new__(uVar10);
  memset(bmp,0,uVar10);
  pDVar8 = (DetectorSS *)hkey;
  hashval[0] = 0;
  hashval[1] = 0;
  hashval[2] = 0;
  hashval[3] = 0;
  hkey[0] = key;
  hkey[1] = key;
  hkey[2] = key;
  MurmurHash3_x64_128(pDVar8,0xc,(uint32_t)*(this->ss_).hash,hashval);
  uVar1 = (this->ss_).tdepth;
  local_60 = (long)(this->ss_).width;
  ppuVar3 = (this->ss_).counts;
  piVar4 = (this->ss_).offsets;
  iVar5 = (this->ss_).c;
  for (uVar10 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar10; uVar10 = uVar10 + 1) {
    iVar7 = (int)((ulong)hashval[uVar10] * local_60 >> 0x20);
    if (uVar10 == 0) {
      iVar2 = piVar4[iVar5];
      Copybmp(pDVar8,bmp,*ppuVar3,iVar7 * iVar2,iVar2);
    }
    else {
      iVar2 = piVar4[iVar5];
      Intersec(pDVar8,bmp,ppuVar3[uVar10],iVar7 * iVar2,iVar2);
    }
  }
  for (lVar9 = 4; lVar9 < (this->ss_).depth; lVar9 = lVar9 + 1) {
    pDVar8 = (DetectorSS *)&key_local;
    uVar6 = MurmurHash64A((DetectorSS *)&key_local,(this->ss_).lgn / 8,(this->ss_).hash[lVar9]);
    iVar5 = (this->ss_).offsets[(this->ss_).c];
    Intersec(pDVar8,bmp,(this->ss_).counts[lVar9],
             (int)((long)(this->ss_).width * (uVar6 & 0xffffffff) >> 0x20) * iVar5,iVar5);
  }
  iVar5 = Estimate(this,0,bmp);
  operator_delete__(bmp);
  return iVar5;
}

Assistant:

int DetectorSS::PointQueryMerge(uint32_t key) {
	int ret = 0;
	unsigned char* mcount = new unsigned char[(ss_.offsets[ss_.c] + 7) >> 3]();
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			Copybmp(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
		}
		else
			Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		Intersec(mcount, ss_.counts[i], bucket * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
	}
	ret = Estimate(0, mcount);
	delete[] mcount;
	return ret;
}